

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [5])

{
  Message *a_message;
  Message local_20 [8];
  char (*local_18) [5];
  char (*value_local) [5];
  AssertionResult *this_local;
  
  local_18 = value;
  value_local = &this->success_;
  testing::Message::Message(local_20);
  a_message = Message::operator<<(local_20,local_18);
  AppendMessage(this,a_message);
  Message::~Message(local_20);
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }